

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocking_counter.cc
# Opt level: O2

bool __thiscall absl::lts_20240722::BlockingCounter::DecrementCount(BlockingCounter *this)

{
  atomic<int> *paVar1;
  int iVar2;
  MutexLock l;
  
  LOCK();
  paVar1 = &this->count_;
  iVar2 = (paVar1->super___atomic_base<int>)._M_i;
  (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + -1;
  UNLOCK();
  if (0 < iVar2) {
    if (iVar2 == 1) {
      l.mu_ = &this->lock_;
      Mutex::Lock(&this->lock_);
      this->done_ = true;
      MutexLock::~MutexLock(&l);
    }
    return iVar2 == 1;
  }
  absl::lts_20240722::raw_log_internal::RawLog
            (kFatal,"blocking_counter.cc",0x29,"Check %s failed: %s","count >= 0",
             "BlockingCounter::DecrementCount() called too many times");
  __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O2/_deps/absl-src/absl/synchronization/blocking_counter.cc"
                ,0x29,"bool absl::BlockingCounter::DecrementCount()");
}

Assistant:

bool BlockingCounter::DecrementCount() {
  int count = count_.fetch_sub(1, std::memory_order_acq_rel) - 1;
  ABSL_RAW_CHECK(count >= 0,
                 "BlockingCounter::DecrementCount() called too many times");
  if (count == 0) {
    MutexLock l(&lock_);
    done_ = true;
    return true;
  }
  return false;
}